

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCec.c
# Opt level: O3

int Fra_FraigCecPartitioned
              (Aig_Man_t *pMan1,Aig_Man_t *pMan2,int nConfLimit,int nPartSize,int fSmart,
              int fVerbose)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  Vec_Ptr_t *__ptr;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  Aig_Man_t *local_38;
  
  __ptr = Aig_ManMiterPartitioned(pMan1,pMan2,nPartSize,fSmart);
  uVar8 = __ptr->nSize;
  if ((int)uVar8 < 1) {
    uVar9 = 0xffffffff;
  }
  else {
    uVar4 = 0;
    do {
      uVar9 = uVar4;
      local_38 = (Aig_Man_t *)__ptr->pArray[uVar9];
      if (fVerbose != 0) {
        uVar1 = local_38->nObjs[2];
        uVar2 = local_38->nObjs[3];
        iVar6 = local_38->nObjs[6];
        iVar3 = local_38->nObjs[5];
        iVar5 = Aig_ManLevelNum(local_38);
        printf("Verifying part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r",
               (ulong)((int)uVar9 + 1),(ulong)uVar8,(ulong)uVar1,(ulong)uVar2,
               (ulong)(uint)(iVar6 + iVar3),iVar5);
        fflush(_stdout);
      }
      iVar6 = Fra_FraigMiterStatus(local_38);
      if (iVar6 == 1) {
        uVar8 = __ptr->nSize;
        lVar7 = (long)(int)uVar8;
      }
      else {
        if (iVar6 == 0) goto LAB_005c8a3c;
        iVar6 = Fra_FraigCec(&local_38,nConfLimit,0);
        uVar8 = __ptr->nSize;
        lVar7 = (long)(int)uVar8;
        if (lVar7 <= (long)uVar9) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        __ptr->pArray[uVar9] = local_38;
        if (iVar6 != 1) goto LAB_005c8a3c;
      }
      uVar4 = uVar9 + 1;
    } while ((long)(uVar9 + 1) < lVar7);
  }
  iVar6 = 1;
LAB_005c8a3c:
  if (fVerbose != 0) {
    printf(
          "                                                                                          \r"
          );
    fflush(_stdout);
  }
  if (iVar6 != -1) {
    if (0 < __ptr->nSize) {
      lVar7 = 0;
      do {
        Aig_ManStop((Aig_Man_t *)__ptr->pArray[lVar7]);
        lVar7 = lVar7 + 1;
      } while (lVar7 < __ptr->nSize);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
    return iVar6;
  }
  printf("Timed out after verifying %d partitions (out of %d).\n",uVar9 & 0xffffffff);
  fflush(_stdout);
}

Assistant:

int Fra_FraigCecPartitioned( Aig_Man_t * pMan1, Aig_Man_t * pMan2, int nConfLimit, int nPartSize, int fSmart, int fVerbose )
{
    Aig_Man_t * pAig;
    Vec_Ptr_t * vParts;
    int i, RetValue = 1, nOutputs;
    // create partitions
    vParts = Aig_ManMiterPartitioned( pMan1, pMan2, nPartSize, fSmart );
    // solve the partitions
    nOutputs = -1;
    Vec_PtrForEachEntry( Aig_Man_t *, vParts, pAig, i )
    {
        nOutputs++;
        if ( fVerbose )
        {
            printf( "Verifying part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r", 
                i+1, Vec_PtrSize(vParts), Aig_ManCiNum(pAig), Aig_ManCoNum(pAig), 
                Aig_ManNodeNum(pAig), Aig_ManLevelNum(pAig) );
            fflush( stdout );
        }
        RetValue = Fra_FraigMiterStatus( pAig );
        if ( RetValue == 1 )
            continue;
        if ( RetValue == 0 )
            break;
        RetValue = Fra_FraigCec( &pAig, nConfLimit, 0 );
        Vec_PtrWriteEntry( vParts, i, pAig );
        if ( RetValue == 1 )
            continue;
        if ( RetValue == 0 )
            break;
        break;
    }
    // clear the result
    if ( fVerbose )
    {
        printf( "                                                                                          \r" );
        fflush( stdout );
    }
    // report the timeout
    if ( RetValue == -1 )
    {
        printf( "Timed out after verifying %d partitions (out of %d).\n", nOutputs, Vec_PtrSize(vParts) );
        fflush( stdout );
    }
    // free intermediate results
    Vec_PtrForEachEntry( Aig_Man_t *, vParts, pAig, i )
        Aig_ManStop( pAig );
    Vec_PtrFree( vParts );
    return RetValue;
}